

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

HashUtil * __thiscall cfd::core::HashUtil::operator<<(HashUtil *this,Pubkey *pubkey)

{
  ByteData local_30;
  Pubkey *local_18;
  Pubkey *pubkey_local;
  HashUtil *this_local;
  
  local_18 = pubkey;
  pubkey_local = (Pubkey *)this;
  Pubkey::GetData(&local_30,pubkey);
  ByteData::Push(&this->buffer_,&local_30);
  ByteData::~ByteData((ByteData *)0x3ed0d9);
  return this;
}

Assistant:

HashUtil &HashUtil::operator<<(const Pubkey &pubkey) {
  buffer_.Push(pubkey.GetData());
  return *this;
}